

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int verify_string(void *buf,flatbuffers_uoffset_t end,flatbuffers_uoffset_t base,
                 flatbuffers_uoffset_t offset)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = offset + base;
  iVar2 = 0x11;
  if ((base < uVar3) && ((uVar3 & 3) == 0 && (ulong)uVar3 + 4 <= (ulong)end)) {
    uVar1 = *(uint *)((long)buf + (ulong)uVar3);
    if (end - (uVar3 + 4) <= uVar1) {
      return 8;
    }
    iVar2 = 7;
    if (*(char *)((long)buf + (ulong)uVar1 + (ulong)(uVar3 + 4)) == '\0') {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static inline int verify_string(const void *buf, uoffset_t end, uoffset_t base, uoffset_t offset)
{
    uoffset_t n;

    verify(check_header(end, base, offset), flatcc_verify_error_string_header_out_of_range_or_unaligned);
    base += offset;
    n = read_uoffset(buf, base);
    base += offset_size;
    verify(end - base > n, flatcc_verify_error_string_out_of_range);
    verify(((uint8_t *)buf + base)[n] == 0, flatcc_verify_error_string_not_zero_terminated);
    return flatcc_verify_ok;
}